

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O3

void __thiscall
matrix_sparse_element_test_inequality_comparison_Test::TestBody
          (matrix_sparse_element_test_inequality_comparison_Test *this)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  char *in_R9;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  peVar1 = (this->super_matrix_sparse_element_test).element;
  bVar2 = &(this->super_matrix_sparse_element_test).value == peVar1->ptr_value;
  bVar3 = &(this->super_matrix_sparse_element_test).column_index == peVar1->ptr_column;
  local_40[0] = (internal)(bVar2 && bVar3);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2 || !bVar3) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"*element != same_element","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x48,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

TEST_F(matrix_sparse_element_test, inequality_comparison) {
  element_type same_element(&column_index, &value);
  EXPECT_FALSE(*element != same_element);

  int different_column = 6;
  double different_value = 2.71;
  element_type different_element(&different_column, &different_value);
  EXPECT_TRUE(*element != different_element);
}